

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseReserved
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location)

{
  bool bVar1;
  LocationRecorder location;
  
  bVar1 = Consume(this,"reserved");
  if (bVar1) {
    if ((this->input_->current_).type == TYPE_STRING) {
      LocationRecorder::LocationRecorder(&location,message_location,10);
      bVar1 = ParseReservedNames(this,message,&location);
    }
    else {
      LocationRecorder::LocationRecorder(&location,message_location,9);
      bVar1 = ParseReservedNumbers(this,message,&location);
    }
    LocationRecorder::~LocationRecorder(&location);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Parser::ParseReserved(DescriptorProto* message,
                           const LocationRecorder& message_location) {
  // Parse the declaration.
  DO(Consume("reserved"));
  if (LookingAtType(io::Tokenizer::TYPE_STRING)) {
    LocationRecorder location(message_location,
                              DescriptorProto::kReservedNameFieldNumber);
    return ParseReservedNames(message, location);
  } else {
    LocationRecorder location(message_location,
                              DescriptorProto::kReservedRangeFieldNumber);
    return ParseReservedNumbers(message, location);
  }
}